

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SET_OF.c
# Opt level: O3

asn_dec_rval_t
SET_OF_decode_uper(asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,
                  asn_per_constraints_t *constraints,void **sptr,asn_per_data_t *pd)

{
  asn_TYPE_member_s *paVar1;
  bool bVar2;
  uint uVar3;
  int32_t iVar4;
  int iVar5;
  void *asn_set_of_x;
  asn_dec_rval_t aVar10;
  size_t extraout_RDX;
  size_t sVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int repeat;
  void *ptr;
  int local_4c;
  asn_per_data_t *local_48;
  void *local_40;
  asn_per_constraint_s *local_38;
  
  paVar1 = td->elements;
  asn_set_of_x = *sptr;
  local_4c = 0;
  if ((opt_codec_ctx != (asn_codec_ctx_t *)0x0) &&
     (sVar6 = opt_codec_ctx->max_stack_size, sVar6 != 0)) {
    lVar7 = (long)opt_codec_ctx - (long)&local_40;
    lVar8 = -lVar7;
    if (lVar7 < 1) {
      lVar8 = lVar7;
    }
    if (SBORROW8(lVar8,-sVar6) == (long)(lVar8 + sVar6) < 0) goto LAB_0014694a;
LAB_001469ab:
    uVar9 = 2;
    goto LAB_00146aac;
  }
LAB_0014694a:
  local_48 = pd;
  if (asn_set_of_x == (void *)0x0) {
    asn_set_of_x = calloc(1,(long)*td->specifics);
    *sptr = asn_set_of_x;
    if (asn_set_of_x == (void *)0x0) goto LAB_001469ab;
  }
  if ((constraints == (asn_per_constraints_t *)0x0) &&
     (constraints = td->per_constraints, constraints == (asn_per_constraints_t *)0x0)) {
LAB_001469d5:
    lVar8 = -1;
    bVar2 = true;
    local_38 = (asn_per_constraint_s *)0x0;
  }
  else {
    if (((constraints->size).flags & APC_EXTENSIBLE) != APC_UNCONSTRAINED) {
      uVar9 = 1;
      iVar4 = per_get_few_bits(local_48,1);
      if (iVar4 < 0) goto LAB_00146aac;
      if (iVar4 != 0) goto LAB_001469d5;
    }
    local_38 = &constraints->size;
    iVar5 = (constraints->size).effective_bits;
    if (iVar5 < 0) {
      lVar8 = -1;
    }
    else {
      uVar3 = per_get_few_bits(local_48,iVar5);
      if ((int)uVar3 < 0) {
LAB_00146aa6:
        uVar9 = 1;
        goto LAB_00146aac;
      }
      lVar8 = (ulong)uVar3 + (constraints->size).lower_bound;
    }
    bVar2 = false;
  }
  do {
    if (lVar8 < 0) {
      iVar5 = -1;
      if (!bVar2) {
        iVar5 = local_38->effective_bits;
      }
      lVar8 = uper_get_length(local_48,iVar5,&local_4c);
      if (lVar8 < 0) goto LAB_00146aa6;
    }
    for (; lVar8 != 0; lVar8 = lVar8 + -1) {
      local_40 = (void *)0x0;
      aVar10.code = (*paVar1->type->uper_decoder)
                              (opt_codec_ctx,paVar1->type,paVar1->per_constraints,&local_40,local_48
                              );
      if (aVar10.code != (asn_dec_rval_t)0x0) {
        uVar9 = (ulong)(uint)aVar10.code;
LAB_00146a91:
        sVar6 = extraout_RDX;
        if (local_40 != (void *)0x0) {
          (*paVar1->type->free_struct)(paVar1->type,local_40,0);
        }
        goto LAB_00146aae;
      }
      iVar5 = asn_set_add(asn_set_of_x,local_40);
      if (iVar5 != 0) {
        uVar9 = 2;
        goto LAB_00146a91;
      }
    }
    lVar8 = -1;
  } while (local_4c != 0);
  uVar9 = 0;
LAB_00146aac:
  sVar6 = 0;
LAB_00146aae:
  aVar10.consumed = sVar6;
  aVar10._0_8_ = uVar9;
  return aVar10;
}

Assistant:

asn_dec_rval_t
SET_OF_decode_uper(asn_codec_ctx_t *opt_codec_ctx, asn_TYPE_descriptor_t *td,
        asn_per_constraints_t *constraints, void **sptr, asn_per_data_t *pd) {
	asn_dec_rval_t rv;
        asn_SET_OF_specifics_t *specs = (asn_SET_OF_specifics_t *)td->specifics;
	asn_TYPE_member_t *elm = td->elements;	/* Single one */
	void *st = *sptr;
	asn_anonymous_set_ *list;
	asn_per_constraint_t *ct;
	int repeat = 0;
	ssize_t nelems;

	if(ASN__STACK_OVERFLOW_CHECK(opt_codec_ctx))
		ASN__DECODE_FAILED;

	/*
	 * Create the target structure if it is not present already.
	 */
	if(!st) {
		st = *sptr = CALLOC(1, specs->struct_size);
		if(!st) ASN__DECODE_FAILED;
	}                                                                       
	list = _A_SET_FROM_VOID(st);

	/* Figure out which constraints to use */
	if(constraints) ct = &constraints->size;
	else if(td->per_constraints) ct = &td->per_constraints->size;
	else ct = 0;

	if(ct && ct->flags & APC_EXTENSIBLE) {
		int value = per_get_few_bits(pd, 1);
		if(value < 0) ASN__DECODE_STARVED;
		if(value) ct = 0;	/* Not restricted! */
	}

	if(ct && ct->effective_bits >= 0) {
		/* X.691, #19.5: No length determinant */
		nelems = per_get_few_bits(pd, ct->effective_bits);
		ASN_DEBUG("Preparing to fetch %ld+%ld elements from %s",
			(long)nelems, ct->lower_bound, td->name);
		if(nelems < 0)  ASN__DECODE_STARVED;
		nelems += ct->lower_bound;
	} else {
		nelems = -1;
	}

	do {
		int i;
		if(nelems < 0) {
			nelems = uper_get_length(pd,
				ct ? ct->effective_bits : -1, &repeat);
			ASN_DEBUG("Got to decode %d elements (eff %d)",
				(int)nelems, (int)(ct ? ct->effective_bits : -1));
			if(nelems < 0) ASN__DECODE_STARVED;
		}

		for(i = 0; i < nelems; i++) {
			void *ptr = 0;
			ASN_DEBUG("SET OF %s decoding", elm->type->name);
			rv = elm->type->uper_decoder(opt_codec_ctx, elm->type,
				elm->per_constraints, &ptr, pd);
			ASN_DEBUG("%s SET OF %s decoded %d, %p",
				td->name, elm->type->name, rv.code, ptr);
			if(rv.code == RC_OK) {
				if(ASN_SET_ADD(list, ptr) == 0)
					continue;
				ASN_DEBUG("Failed to add element into %s",
					td->name);
				/* Fall through */
				rv.code = RC_FAIL;
			} else {
				ASN_DEBUG("Failed decoding %s of %s (SET OF)",
					elm->type->name, td->name);
			}
			if(ptr) ASN_STRUCT_FREE(*elm->type, ptr);
			return rv;
		}

		nelems = -1;	/* Allow uper_get_length() */
	} while(repeat);

	ASN_DEBUG("Decoded %s as SET OF", td->name);

	rv.code = RC_OK;
	rv.consumed = 0;
	return rv;
}